

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

uint32_t __thiscall
spirv_cross::CompilerMSL::get_declared_input_alignment_msl
          (CompilerMSL *this,SPIRType *type,uint32_t index)

{
  bool row_major;
  uint32_t uVar1;
  undefined1 local_168 [192];
  uint *local_a8;
  size_t local_a0;
  uint local_90 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_50;
  
  get_presumed_input_type((SPIRType *)local_168,this,type,index);
  row_major = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                         DecorationRowMajor);
  uVar1 = get_declared_type_alignment_msl(this,(SPIRType *)local_168,false,row_major);
  local_168._0_8_ = &PTR__SPIRType_003d5290;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_50);
  local_a0 = 0;
  if (local_a8 != local_90) {
    free(local_a8);
  }
  local_168._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_168._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_168 + 0xa0)) {
    free((void *)local_168._136_8_);
  }
  local_168._96_8_ = 0;
  if ((undefined1 *)local_168._88_8_ != local_168 + 0x70) {
    free((void *)local_168._88_8_);
  }
  local_168._40_8_ = 0;
  if ((undefined1 *)local_168._32_8_ != local_168 + 0x38) {
    free((void *)local_168._32_8_);
  }
  return uVar1;
}

Assistant:

uint32_t CompilerMSL::get_declared_input_alignment_msl(const SPIRType &type, uint32_t index) const
{
	return get_declared_type_alignment_msl(get_presumed_input_type(type, index), false,
	                                       has_member_decoration(type.self, index, DecorationRowMajor));
}